

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avg_test.cc
# Opt level: O2

void __thiscall
anon_unknown.dwarf_171beb8::AverageTest8bpp_DISABLED_Speed_Test::TestBody
          (AverageTest8bpp_DISABLED_Speed_Test *this)

{
  ParamType *pPVar1;
  
  AverageTest<unsigned_char>::TestRandom(&this->super_AverageTest8bpp,1000000);
  pPVar1 = testing::
           WithParamInterface<std::tuple<int,_int,_int,_int,_int,_unsigned_int_(*)(const_unsigned_char_*,_int)>_>
           ::GetParam();
  printf("block_size = %d \t ref_time = %d \t simd_time = %d \t Gain = %4.2f\n",
         (double)((float)(this->super_AverageTest8bpp).ref_elapsed_time_ /
                 (float)(this->super_AverageTest8bpp).opt_elapsed_time_),
         (ulong)(uint)(pPVar1->
                      super__Tuple_impl<0UL,_int,_int,_int,_int,_int,_unsigned_int_(*)(const_unsigned_char_*,_int)>
                      ).
                      super__Tuple_impl<1UL,_int,_int,_int,_int,_unsigned_int_(*)(const_unsigned_char_*,_int)>
                      .
                      super__Tuple_impl<2UL,_int,_int,_int,_unsigned_int_(*)(const_unsigned_char_*,_int)>
                      .
                      super__Tuple_impl<3UL,_int,_int,_unsigned_int_(*)(const_unsigned_char_*,_int)>
                      .super__Tuple_impl<4UL,_int,_unsigned_int_(*)(const_unsigned_char_*,_int)>.
                      super__Head_base<4UL,_int,_false>._M_head_impl);
  return;
}

Assistant:

TEST_P(AverageTest8bpp, DISABLED_Speed) {
  TestRandom(1000000);
  PrintTimingStats();
}